

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O1

void __thiscall QWidgetLineControl::internalInsert(QWidgetLineControl *this,QString *s)

{
  ushort uVar1;
  int iVar2;
  char16_t *pcVar3;
  long lVar4;
  int i;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  QAccessibleTextInsertEvent insertEvent;
  QString local_b8;
  undefined1 local_98 [4];
  int iStack_94;
  char16_t *pcStack_90;
  long local_88;
  undefined4 uStack_80;
  int iStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  long local_68;
  undefined4 uStack_60;
  int iStack_5c;
  int local_58;
  undefined4 uStack_54;
  QArrayData *pQStack_50;
  char16_t *local_48;
  QString *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(ushort *)(this + 0x50) & 0x30) == 0x20) {
    if (*(int *)(this + 0x124) != 0) {
      QBasicTimer::stop();
    }
    if (0 < (long)*(int *)(this + 0x128)) {
      QBasicTimer::start(this + 0x124,(long)*(int *)(this + 0x128) * 1000000,1,this);
    }
  }
  if (*(int *)(this + 0x110) < *(int *)(this + 0x114) && *(long *)(this + 0x28) != 0) {
    uVar1 = (ushort)local_78;
    local_78._0_4_ = (uint)(uVar1 & 0xfff0 | 6);
    local_78 = (code *)CONCAT44(*(undefined4 *)(this + 0x40),(uint)local_78);
    uStack_70 = *(undefined8 *)(this + 0x110);
    addCommand(this,(Command *)&local_78);
  }
  if (*(long *)(this + 0xe8) == 0) {
    lVar6 = (long)(*(int *)(this + 0x60) - *(int *)(this + 0x28));
    if (*(int *)(this + 0x60) - *(int *)(this + 0x28) != 0) {
      local_68 = *(long *)(this + 0x130);
      if (local_68 == 0) {
        local_68 = *(long *)(*(long *)(this + 8) + 0x10);
      }
      pQStack_40 = (QString *)(s->d).size;
      _uStack_60 = CONCAT44((int)pQStack_40 + *(int *)(this + 0x40),0xffffffff);
      local_78 = QPainterPath::contains;
      _local_58 = CONCAT44(0xaaaaaaaa,*(int *)(this + 0x40));
      pQStack_50 = &((s->d).d)->super_QArrayData;
      local_48 = (s->d).ptr;
      if (pQStack_50 != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&pQStack_50->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&pQStack_50->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      uStack_70._0_4_ = 0x11e;
      uStack_70._4_4_ = -0x55555556;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_78);
      iVar2 = *(int *)(this + 0x40);
      QString::left((QString *)local_98,s,lVar6);
      pcVar3 = pcStack_90;
      if (pcStack_90 == (char16_t *)0x0) {
        pcVar3 = (char16_t *)&QString::_empty;
      }
      QString::insert((longlong)(this + 0x18),(QChar *)(long)iVar2,(longlong)pcVar3);
      if ((QArrayData *)_local_98 != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)_local_98)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)_local_98)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QArrayData *)_local_98)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)_local_98,2,0x10);
        }
      }
      lVar5 = 0;
      while( true ) {
        QString::left((QString *)local_98,s,lVar6);
        lVar4 = (long)(int)local_88;
        if ((QArrayData *)_local_98 != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)_local_98)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)_local_98)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QArrayData *)_local_98)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)_local_98,2,0x10);
          }
        }
        if (lVar4 <= lVar5) break;
        iVar2 = *(int *)(this + 0x40);
        *(int *)(this + 0x40) = iVar2 + 1;
        _local_98 = (code *)CONCAT71(stack0xffffffffffffff69,((byte)local_98[0] & 0xf0) + 1);
        local_98 = (undefined1  [4])CONCAT22((s->d).ptr[lVar5],local_98._0_2_);
        _local_98 = (code *)CONCAT44(iVar2,local_98);
        pcStack_90 = (char16_t *)0xffffffffffffffff;
        addCommand(this,(Command *)local_98);
        lVar5 = lVar5 + 1;
      }
      this[0x50] = (QWidgetLineControl)((byte)this[0x50] | 0x40);
      QAccessibleTextInsertEvent::~QAccessibleTextInsertEvent
                ((QAccessibleTextInsertEvent *)&local_78);
    }
    if (lVar6 < (s->d).size) {
      QMetaObject::activate((QObject *)this,&staticMetaObject,10,(void **)0x0);
    }
  }
  else {
    local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    maskString(&local_b8,this,*(int *)(this + 0x40),s,false);
    if (((QString *)local_b8.d.size == (QString *)0x0) && ((s->d).size != 0)) {
      QMetaObject::activate((QObject *)this,&staticMetaObject,10,(void **)0x0);
    }
    local_68 = *(long *)(this + 0x130);
    if (local_68 == 0) {
      local_68 = *(long *)(*(long *)(this + 8) + 0x10);
    }
    _uStack_60 = CONCAT44((int)local_b8.d.size + *(int *)(this + 0x40),0xffffffff);
    local_78 = QPainterPath::contains;
    _local_58 = CONCAT44(0xaaaaaaaa,*(int *)(this + 0x40));
    pQStack_50 = &(local_b8.d.d)->super_QArrayData;
    local_48 = local_b8.d.ptr;
    pQStack_40 = (QString *)local_b8.d.size;
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    uStack_70._0_4_ = 0x11e;
    uStack_70._4_4_ = -0x55555556;
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_78);
    if (0 < (int)local_b8.d.size) {
      lVar6 = 0;
      do {
        _local_98 = (code *)(CONCAT44((int)lVar6 + *(int *)(this + 0x40),
                                      CONCAT22(*(undefined2 *)
                                                (*(long *)(this + 0x20) +
                                                (*(int *)(this + 0x40) + lVar6) * 2),
                                               (short)_local_98)) & 0xfffffffffffffff0 | 5);
        pcStack_90 = (char16_t *)0xffffffffffffffff;
        addCommand(this,(Command *)local_98);
        _local_98 = (code *)CONCAT71(stack0xffffffffffffff69,((byte)local_98[0] & 0xf0) + 1);
        local_98 = (undefined1  [4])CONCAT22(local_b8.d.ptr[lVar6],local_98._0_2_);
        _local_98 = (code *)CONCAT44(*(int *)(this + 0x40) + (int)lVar6,local_98);
        pcStack_90 = (char16_t *)0xffffffffffffffff;
        addCommand(this,(Command *)local_98);
        lVar6 = lVar6 + 1;
      } while (lVar6 < (int)local_b8.d.size);
    }
    QString::replace((longlong)(this + 0x18),(long)*(int *)(this + 0x40),(QString *)local_b8.d.size)
    ;
    iVar2 = *(int *)(this + 0x40);
    *(int *)(this + 0x40) = iVar2 + (int)local_b8.d.size;
    iVar2 = nextMaskBlank(this,iVar2 + (int)local_b8.d.size);
    *(int *)(this + 0x40) = iVar2;
    this[0x50] = (QWidgetLineControl)((byte)this[0x50] | 0x40);
    local_88 = *(long *)(this + 0x130);
    if (local_88 == 0) {
      local_88 = *(long *)(*(long *)(this + 8) + 0x10);
    }
    _local_98 = QTextCursor::isNull;
    _uStack_80 = CONCAT44(iVar2,0xffffffff);
    pcStack_90 = (char16_t *)0xaaaaaaaa0000011b;
    QAccessible::updateAccessibility((QAccessibleEvent *)local_98);
    QAccessibleTextCursorEvent::~QAccessibleTextCursorEvent((QAccessibleTextCursorEvent *)local_98);
    QAccessibleTextInsertEvent::~QAccessibleTextInsertEvent((QAccessibleTextInsertEvent *)&local_78)
    ;
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetLineControl::internalInsert(const QString &s)
{
    if (m_echoMode == QLineEdit::Password) {
        if (m_passwordEchoTimer.isActive())
            m_passwordEchoTimer.stop();
        int delay = m_passwordMaskDelay;
#ifdef QT_BUILD_INTERNAL
        if (m_passwordMaskDelayOverride >= 0)
            delay = m_passwordMaskDelayOverride;
#endif

        if (delay > 0)
            m_passwordEchoTimer.start(delay * 1ms, this);
    }
    if (hasSelectedText())
        addCommand(Command(SetSelection, m_cursor, u'\0', m_selstart, m_selend));
    if (m_maskData) {
        QString ms = maskString(m_cursor, s);
        if (ms.isEmpty() && !s.isEmpty())
            emit inputRejected();
#if QT_CONFIG(accessibility)
        QAccessibleTextInsertEvent insertEvent(accessibleObject(), m_cursor, ms);
        QAccessible::updateAccessibility(&insertEvent);
#endif
        for (int i = 0; i < (int) ms.size(); ++i) {
            addCommand (Command(DeleteSelection, m_cursor + i, m_text.at(m_cursor + i), -1, -1));
            addCommand(Command(Insert, m_cursor + i, ms.at(i), -1, -1));
        }
        m_text.replace(m_cursor, ms.size(), ms);
        m_cursor += ms.size();
        m_cursor = nextMaskBlank(m_cursor);
        m_textDirty = true;
#if QT_CONFIG(accessibility)
        QAccessibleTextCursorEvent event(accessibleObject(), m_cursor);
        QAccessible::updateAccessibility(&event);
#endif
    } else {
        int remaining = m_maxLength - m_text.size();
        if (remaining != 0) {
#if QT_CONFIG(accessibility)
            QAccessibleTextInsertEvent insertEvent(accessibleObject(), m_cursor, s);
            QAccessible::updateAccessibility(&insertEvent);
#endif
            m_text.insert(m_cursor, s.left(remaining));
            for (int i = 0; i < (int) s.left(remaining).size(); ++i)
               addCommand(Command(Insert, m_cursor++, s.at(i), -1, -1));
            m_textDirty = true;
        }
        if (s.size() > remaining)
            emit inputRejected();
    }
}